

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O0

double __thiscall NetworkNS::RanMars::gaussian(RanMars *this)

{
  bool bVar1;
  double dVar2;
  int again;
  double fac;
  double rsq;
  double v2;
  double v1;
  double first;
  RanMars *this_local;
  
  if (this->save == 0) {
    bVar1 = true;
    while (bVar1) {
      dVar2 = uniform(this);
      v2 = dVar2 + dVar2 + -1.0;
      dVar2 = uniform(this);
      rsq = dVar2 + dVar2 + -1.0;
      fac = v2 * v2 + rsq * rsq;
      if ((fac < 1.0) && ((fac != 0.0 || (NAN(fac))))) {
        bVar1 = false;
      }
    }
    dVar2 = log(fac);
    dVar2 = sqrt((dVar2 * -2.0) / fac);
    this->second = v2 * dVar2;
    v1 = rsq * dVar2;
    this->save = 1;
  }
  else {
    v1 = this->second;
    this->save = 0;
  }
  return v1;
}

Assistant:

double RanMars::gaussian() {
      double first, v1, v2, rsq, fac;

      if (!save) {
         int again = 1;
         while (again) {
            v1 = 2.0 * uniform() - 1.0;
            v2 = 2.0 * uniform() - 1.0;
            rsq = v1 * v1 + v2*v2;
            if (rsq < 1.0 && rsq != 0.0) again = 0;
         }
         fac = sqrt(-2.0 * log(rsq) / rsq);
         second = v1*fac;
         first = v2*fac;
         save = 1;
      } else {
         first = second;
         save = 0;
      }
      return first;
   }